

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

Result __thiscall tonk::gateway::AsioHost::Initialize(AsioHost *this)

{
  bool bVar1;
  ErrorResult *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  ErrorResult *this_00;
  AsioHost *in_stack_ffffffffffffffc0;
  io_context *in_stack_ffffffffffffffc8;
  AsioHost **in_stack_ffffffffffffffd0;
  type *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  MakeUniqueNoThrow<asio::io_context>();
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator=
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)this_00,
             (unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)this_00);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
                     0x20787a);
  if (bVar1) {
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x20789b);
    asio::io_context::restart((io_context *)0x2078a3);
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator*
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)this_00);
    MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>(in_stack_ffffffffffffffc8);
    std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
    operator=((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
               *)this_00,
              (unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
    ~unique_ptr((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
                 *)this_00);
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator*
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)this_00);
    MakeUniqueNoThrow<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,asio::io_context&>
              (in_stack_ffffffffffffffc8);
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::operator=((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                 *)this_00,
                (unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                   *)this_00);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                        *)0x207921);
    if ((bVar1) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
                            *)0x207935), bVar1)) {
      TickAndPostNextTimer(in_stack_ffffffffffffffc0);
      std::atomic<bool>::operator=((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffff9f);
      MakeUniqueNoThrow<std::thread,void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*>
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
                ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)this_00,
                 (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)this_00);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x2079c0);
      if (bVar1) {
        Result::Success();
      }
      else {
        Result::OutOfMemory();
      }
    }
    else {
      Result::OutOfMemory();
    }
  }
  else {
    Result::OutOfMemory();
  }
  return (Result)in_RDI;
}

Assistant:

Result AsioHost::Initialize()
{
    Context = MakeUniqueNoThrow<asio::io_context>();
    if (!Context) {
        return Result::OutOfMemory();
    }
    Context->restart();

    AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Context);
    Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
    if (!Ticker || !AsioEventStrand) {
        return Result::OutOfMemory();
    }

    /*
        Asio bug work-around: If we do not keep some work queued for Asio it
        will internally call stop() for some reason and then use a ton of
        CPU expecting us to end our worker threads.  The best way I've found
        to prevent the work-queue to go to 0 items is to keep a timer queued
        from before the first worker starts running.  The timer OnTick()
        keeps re-queuing a timer tick so the work-queue is never empty.
    */
    TickAndPostNextTimer();

    Terminated = false;
    AsioThread = MakeUniqueNoThrow<std::thread>(&AsioHost::WorkerLoop, this);
    if (!AsioThread) {
        return Result::OutOfMemory();
    }

    return Result::Success();
}